

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O3

void uv::TCPClient::AfterConnect(uv_connect_t *handle,int status)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ILog4zManager *pIVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  ulong *in_FS_OFFSET;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  lVar2 = *(long *)((long)handle->handle->data + 0x1d8);
  if (status == 0) {
    iVar10 = uv_read_start(handle->handle,AllocBufferForRecv,AfterRecv);
    if (iVar10 == 0) {
      *(undefined4 *)(lVar2 + 0x450) = 1;
      pcVar3 = (char *)*in_FS_OFFSET;
      pcVar1 = pcVar3 + -0x800;
      builtin_strncpy(pcVar3 + -0x800,"client(",8);
      uVar5 = snprintf(pcVar3 + -0x7f9,0x7f9,"%016llx",lVar2);
      iVar10 = (int)pcVar3;
      if ((int)uVar5 < 0) {
        pcVar3[-0x7f9] = '\0';
        pcVar12 = pcVar1;
LAB_00119077:
        pcVar12 = pcVar12 + 7;
        iVar11 = iVar10 - (int)pcVar12;
        iVar6 = snprintf(pcVar12,(long)iVar11,"%s",")run");
        pcVar9 = pcVar12;
        iVar7 = 0;
        if (iVar6 < 0) {
LAB_001190b4:
          iVar6 = iVar7;
          *pcVar9 = '\0';
        }
        else if (iVar11 <= iVar6) {
          pcVar9 = pcVar3 + -1;
          iVar7 = iVar11;
          goto LAB_001190b4;
        }
        pcVar12 = pcVar12 + iVar6;
      }
      else {
        if (uVar5 < 0x7f9) {
          pcVar12 = pcVar1 + uVar5;
          goto LAB_00119077;
        }
        pcVar3[-1] = '\0';
        pcVar12 = pcVar3;
      }
      if (pcVar12 < pcVar3) {
        iVar11 = iVar10 - (int)pcVar12;
        iVar6 = snprintf(pcVar12,(long)iVar11,"%s"," ( ");
        pcVar9 = pcVar12;
        iVar7 = 0;
        if (iVar6 < 0) {
LAB_00119109:
          iVar6 = iVar7;
          *pcVar9 = '\0';
        }
        else if (iVar11 <= iVar6) {
          pcVar9 = pcVar3 + -1;
          iVar7 = iVar11;
          goto LAB_00119109;
        }
        pcVar12 = pcVar12 + iVar6;
      }
      if (pcVar12 < pcVar3) {
        iVar11 = iVar10 - (int)pcVar12;
        iVar6 = snprintf(pcVar12,(long)iVar11,"%s"," ");
        pcVar9 = pcVar12;
        iVar7 = 0;
        if (iVar6 < 0) {
LAB_00119151:
          iVar6 = iVar7;
          *pcVar9 = '\0';
        }
        else if (iVar11 <= iVar6) {
          pcVar9 = pcVar3 + -1;
          iVar7 = iVar11;
          goto LAB_00119151;
        }
        pcVar12 = pcVar12 + iVar6;
      }
      if (pcVar12 < pcVar3) {
        iVar11 = iVar10 - (int)pcVar12;
        iVar6 = snprintf(pcVar12,(long)iVar11,"%s"," ) : ");
        pcVar9 = pcVar12;
        iVar7 = 0;
        if (iVar6 < 0) {
LAB_00119199:
          iVar6 = iVar7;
          *pcVar9 = '\0';
        }
        else if (iVar11 <= iVar6) {
          pcVar9 = pcVar3 + -1;
          iVar7 = iVar11;
          goto LAB_00119199;
        }
        pcVar12 = pcVar12 + iVar6;
      }
      if (pcVar12 < pcVar3) {
        iVar10 = iVar10 - (int)pcVar12;
        iVar7 = snprintf(pcVar12,(long)iVar10,"%d",0x122);
        if (-1 < iVar7) {
          if (iVar7 < iVar10) goto LAB_001191db;
          pcVar12 = pcVar3 + -1;
        }
        *pcVar12 = '\0';
      }
LAB_001191db:
      pIVar8 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar8->_vptr_ILog4zManager[8])(pIVar8,0,1,pcVar1);
      goto LAB_001191f4;
    }
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::operator=((string *)(lVar2 + 0x5c0),(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    pcVar3 = (char *)*in_FS_OFFSET;
    pcVar1 = pcVar3 + -0x800;
    builtin_strncpy(pcVar3 + -0x800,"client(",8);
    uVar5 = snprintf(pcVar3 + -0x7f9,0x7f9,"%016llx",lVar2);
    iVar10 = (int)pcVar3;
    if ((int)uVar5 < 0) {
      pcVar3[-0x7f9] = '\0';
      pcVar12 = pcVar1;
LAB_00118e3e:
      pcVar12 = pcVar12 + 7;
      iVar11 = iVar10 - (int)pcVar12;
      iVar6 = snprintf(pcVar12,(long)iVar11,"%s",") uv_read_start error:");
      pcVar9 = pcVar12;
      iVar7 = 0;
      if (iVar6 < 0) {
LAB_00118e7b:
        iVar6 = iVar7;
        *pcVar9 = '\0';
      }
      else if (iVar11 <= iVar6) {
        pcVar9 = pcVar3 + -1;
        iVar7 = iVar11;
        goto LAB_00118e7b;
      }
      pcVar12 = pcVar12 + iVar6;
    }
    else {
      if (uVar5 < 0x7f9) {
        pcVar12 = pcVar1 + uVar5;
        goto LAB_00118e3e;
      }
      pcVar3[-1] = '\0';
      pcVar12 = pcVar3;
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,*(long *)(lVar2 + 0x5c0),
               *(long *)(lVar2 + 0x5c8) + *(long *)(lVar2 + 0x5c0));
    if (pcVar12 < pcVar3) {
      iVar11 = iVar10 - (int)pcVar12;
      iVar6 = snprintf(pcVar12,(long)iVar11,"%s",local_70[0]);
      pcVar9 = pcVar12;
      iVar7 = 0;
      if (iVar6 < 0) {
LAB_00118ef4:
        iVar6 = iVar7;
        *pcVar9 = '\0';
      }
      else if (iVar11 <= iVar6) {
        pcVar9 = pcVar3 + -1;
        iVar7 = iVar11;
        goto LAB_00118ef4;
      }
      pcVar12 = pcVar12 + iVar6;
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (pcVar12 < pcVar3) {
      iVar11 = iVar10 - (int)pcVar12;
      iVar6 = snprintf(pcVar12,(long)iVar11,"%s"," ( ");
      pcVar9 = pcVar12;
      iVar7 = 0;
      if (iVar6 < 0) {
LAB_00118f57:
        iVar6 = iVar7;
        *pcVar9 = '\0';
      }
      else if (iVar11 <= iVar6) {
        pcVar9 = pcVar3 + -1;
        iVar7 = iVar11;
        goto LAB_00118f57;
      }
      pcVar12 = pcVar12 + iVar6;
    }
    if (pcVar12 < pcVar3) {
      iVar11 = iVar10 - (int)pcVar12;
      iVar6 = snprintf(pcVar12,(long)iVar11,"%s"," ");
      pcVar9 = pcVar12;
      iVar7 = 0;
      if (iVar6 < 0) {
LAB_00118f9f:
        iVar6 = iVar7;
        *pcVar9 = '\0';
      }
      else if (iVar11 <= iVar6) {
        pcVar9 = pcVar3 + -1;
        iVar7 = iVar11;
        goto LAB_00118f9f;
      }
      pcVar12 = pcVar12 + iVar6;
    }
    if (pcVar12 < pcVar3) {
      iVar11 = iVar10 - (int)pcVar12;
      iVar6 = snprintf(pcVar12,(long)iVar11,"%s"," ) : ");
      pcVar9 = pcVar12;
      iVar7 = 0;
      if (iVar6 < 0) {
LAB_00118fe7:
        iVar6 = iVar7;
        *pcVar9 = '\0';
      }
      else if (iVar11 <= iVar6) {
        pcVar9 = pcVar3 + -1;
        iVar7 = iVar11;
        goto LAB_00118fe7;
      }
      pcVar12 = pcVar12 + iVar6;
    }
    if (pcVar12 < pcVar3) {
      iVar10 = iVar10 - (int)pcVar12;
      iVar7 = snprintf(pcVar12,(long)iVar10,"%d",0x11d);
      if (-1 < iVar7) {
        if (iVar7 < iVar10) goto LAB_00119029;
        pcVar12 = pcVar3 + -1;
      }
      *pcVar12 = '\0';
    }
LAB_00119029:
    pIVar8 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar8->_vptr_ILog4zManager[8])(pIVar8,0,3,pcVar1);
    fprintf(_stdout,"uv_read_start error:%s\n",*(undefined8 *)(lVar2 + 0x5c0));
    *(undefined4 *)(lVar2 + 0x450) = 2;
LAB_001191f4:
    if (*(char *)(lVar2 + 0x588) != '\x01') {
      return;
    }
    fwrite("reconnect succeed\n",0x12,1,_stdout);
    *(undefined1 *)(lVar2 + 0x588) = 0;
    *(undefined8 *)*(undefined8 *)(lVar2 + 8) = *(undefined8 *)(lVar2 + 8);
    *(undefined8 *)(lVar2 + 0x590) = 1000;
    uv_timer_stop(lVar2 + 0x4f0);
    if (*(code **)(lVar2 + 0x4e0) == (code *)0x0) {
      return;
    }
    (**(code **)(lVar2 + 0x4e0))(0,*(undefined8 *)(lVar2 + 0x4e8));
    return;
  }
  *(undefined4 *)(lVar2 + 0x450) = 2;
  GetUVError_abi_cxx11_(&local_90,status);
  std::__cxx11::string::operator=((string *)(lVar2 + 0x5c0),(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  pcVar3 = (char *)*in_FS_OFFSET;
  pcVar1 = pcVar3 + -0x800;
  builtin_strncpy(pcVar3 + -0x800,"client(",8);
  uVar5 = snprintf(pcVar3 + -0x7f9,0x7f9,"%016llx",lVar2);
  iVar10 = (int)pcVar3;
  if ((int)uVar5 < 0) {
    pcVar3[-0x7f9] = '\0';
    pcVar12 = pcVar1;
LAB_00118b6b:
    pcVar12 = pcVar12 + 7;
    iVar11 = iVar10 - (int)pcVar12;
    iVar6 = snprintf(pcVar12,(long)iVar11,"%s",") connect error:");
    pcVar9 = pcVar12;
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_00118ba8:
      iVar6 = iVar7;
      *pcVar9 = '\0';
    }
    else if (iVar11 <= iVar6) {
      pcVar9 = pcVar3 + -1;
      iVar7 = iVar11;
      goto LAB_00118ba8;
    }
    pcVar12 = pcVar12 + iVar6;
  }
  else {
    if (uVar5 < 0x7f9) {
      pcVar12 = pcVar1 + uVar5;
      goto LAB_00118b6b;
    }
    pcVar3[-1] = '\0';
    pcVar12 = pcVar3;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)(lVar2 + 0x5c0),
             *(long *)(lVar2 + 0x5c8) + *(long *)(lVar2 + 0x5c0));
  if (pcVar12 < pcVar3) {
    iVar11 = iVar10 - (int)pcVar12;
    iVar6 = snprintf(pcVar12,(long)iVar11,"%s",local_50[0]);
    pcVar9 = pcVar12;
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_00118c24:
      iVar6 = iVar7;
      *pcVar9 = '\0';
    }
    else if (iVar11 <= iVar6) {
      pcVar9 = pcVar3 + -1;
      iVar7 = iVar11;
      goto LAB_00118c24;
    }
    pcVar12 = pcVar12 + iVar6;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (pcVar12 < pcVar3) {
    iVar11 = iVar10 - (int)pcVar12;
    iVar6 = snprintf(pcVar12,(long)iVar11,"%s"," ( ");
    pcVar9 = pcVar12;
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_00118c87:
      iVar6 = iVar7;
      *pcVar9 = '\0';
    }
    else if (iVar11 <= iVar6) {
      pcVar9 = pcVar3 + -1;
      iVar7 = iVar11;
      goto LAB_00118c87;
    }
    pcVar12 = pcVar12 + iVar6;
  }
  if (pcVar12 < pcVar3) {
    iVar11 = iVar10 - (int)pcVar12;
    iVar6 = snprintf(pcVar12,(long)iVar11,"%s"," ");
    pcVar9 = pcVar12;
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_00118ccf:
      iVar6 = iVar7;
      *pcVar9 = '\0';
    }
    else if (iVar11 <= iVar6) {
      pcVar9 = pcVar3 + -1;
      iVar7 = iVar11;
      goto LAB_00118ccf;
    }
    pcVar12 = pcVar12 + iVar6;
  }
  if (pcVar12 < pcVar3) {
    iVar11 = iVar10 - (int)pcVar12;
    iVar6 = snprintf(pcVar12,(long)iVar11,"%s"," ) : ");
    pcVar9 = pcVar12;
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_00118d17:
      iVar6 = iVar7;
      *pcVar9 = '\0';
    }
    else if (iVar11 <= iVar6) {
      pcVar9 = pcVar3 + -1;
      iVar7 = iVar11;
      goto LAB_00118d17;
    }
    pcVar12 = pcVar12 + iVar6;
  }
  if (pcVar12 < pcVar3) {
    iVar10 = iVar10 - (int)pcVar12;
    iVar7 = snprintf(pcVar12,(long)iVar10,"%d",0x110);
    if (-1 < iVar7) {
      if (iVar7 < iVar10) goto LAB_00118d59;
      pcVar12 = pcVar3 + -1;
    }
    *pcVar12 = '\0';
  }
LAB_00118d59:
  pIVar8 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar8->_vptr_ILog4zManager[8])(pIVar8,0,3,pcVar1);
  fprintf(_stdout,"connect error:%s\n",*(undefined8 *)(lVar2 + 0x5c0));
  if (*(char *)(lVar2 + 0x588) == '\x01') {
    uv_timer_stop(lVar2 + 0x4f0);
    lVar4 = *(long *)(lVar2 + 0x590) * 2;
    *(long *)(lVar2 + 0x590) = lVar4;
    uv_timer_start(lVar2 + 0x4f0,ReconnectTimer,lVar4);
  }
  return;
}

Assistant:

void TCPClient::AfterConnect(uv_connect_t* handle, int status)
{
    TcpClientCtx* theclass = (TcpClientCtx*)handle->handle->data;
    TCPClient* parent = (TCPClient*)theclass->parent_server;
    if (status) {
        parent->connectstatus_ = CONNECT_ERROR;
        parent->errmsg_ = GetUVError(status);
        LOGE("client(" << parent << ") connect error:" << parent->errmsg_);
        fprintf(stdout, "connect error:%s\n", parent->errmsg_.c_str());
        if (parent->isreconnecting_) {//reconnect failure, restart timer to trigger reconnect.
            uv_timer_stop(&parent->reconnect_timer_);
            parent->repeat_time_ *= 2;
            uv_timer_start(&parent->reconnect_timer_, TCPClient::ReconnectTimer, parent->repeat_time_, parent->repeat_time_);
        }
        return;
    }

    int iret = uv_read_start(handle->handle, AllocBufferForRecv, AfterRecv);
    if (iret) {
        parent->errmsg_ = GetUVError(status);
        LOGE("client(" << parent << ") uv_read_start error:" << parent->errmsg_);
        fprintf(stdout, "uv_read_start error:%s\n", parent->errmsg_.c_str());
        parent->connectstatus_ = CONNECT_ERROR;
    } else {
        parent->connectstatus_ = CONNECT_FINISH;
        LOGI("client(" << parent << ")run");
    }
    if (parent->isreconnecting_) {
        fprintf(stdout, "reconnect succeed\n");
        parent->StopReconnect();//reconnect succeed.
        if (parent->reconnectcb_) {
            parent->reconnectcb_(NET_EVENT_TYPE_RECONNECT, parent->reconnect_userdata_);
        }
    }
}